

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-util.c
# Opt level: O0

_Bool obj_kind_can_browse(object_kind *kind)

{
  undefined4 uVar1;
  undefined4 uVar2;
  class_book_conflict *pcVar3;
  int local_40;
  int iStack_3c;
  class_book book;
  wchar_t i;
  object_kind *kind_local;
  
  book.spells._4_4_ = 0;
  while( true ) {
    if ((player->class->magic).num_books <= book.spells._4_4_) {
      return false;
    }
    pcVar3 = (player->class->magic).books + book.spells._4_4_;
    uVar1 = pcVar3->tval;
    uVar2 = pcVar3->sval;
    if ((kind->tval == uVar1) && (kind->sval == uVar2)) break;
    book.spells._4_4_ = book.spells._4_4_ + 1;
  }
  return true;
}

Assistant:

bool obj_kind_can_browse(const struct object_kind *kind)
{
	int i;

	for (i = 0; i < player->class->magic.num_books; i++) {
		struct class_book book = player->class->magic.books[i];
		if (kind->tval == book.tval && kind->sval == book.sval)
			return true;
	}

	return false;
}